

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O3

Info * __thiscall
SpecificStrategy::extractInfo(Info *__return_storage_ptr__,SpecificStrategy *this,CFG *cfg)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Node *__tmp;
  _List_node_base *p_Var5;
  long *plVar6;
  CfgData data;
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  local_1a0;
  Edge local_170;
  CfgData local_158;
  
  p_Var1 = &(__return_storage_ptr__->instrs)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->instrs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->blocks).perfect._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->blocks).perfect._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->blocks).perfect._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->blocks).perfect._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->blocks).perfect._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->blocks).perfect._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->blocks).conflict._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->blocks).conflict._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->blocks).conflict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->blocks).conflict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->blocks).conflict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->blocks).conflict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->phantoms)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->phantoms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = p_Var1;
  (__return_storage_ptr__->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(__return_storage_ptr__->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = p_Var1;
  (__return_storage_ptr__->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(__return_storage_ptr__->edges).external.perfect._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->edges).external.perfect._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->edges).external.perfect._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).external.perfect._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).external.perfect._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = p_Var1;
  (__return_storage_ptr__->edges).external.perfect._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(__return_storage_ptr__->edges).external.conflict._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->edges).external.conflict._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->edges).external.conflict._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).external.conflict._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->edges).external.conflict._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = p_Var1;
  (__return_storage_ptr__->edges).external.conflict._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(__return_storage_ptr__->calls)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->calls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->indirects)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (__return_storage_ptr__->indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->indirects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CfgData::CfgData(&local_158,cfg);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)__return_storage_ptr__,&local_158.m_instrs._M_t);
  std::
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  ::operator=((_Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
               *)&__return_storage_ptr__->blocks,&local_158.m_blocks._M_t);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=(&(__return_storage_ptr__->phantoms)._M_t,&local_158.m_phantoms._M_t);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::_Rb_tree(&local_1a0,&local_158.m_edges._M_t);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::operator=((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
               *)&(__return_storage_ptr__->edges).external,&local_1a0);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::~_Rb_tree(&local_1a0);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::_Rb_tree((_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
              *)&local_1a0,&local_158.m_calls._M_t);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::operator=(&(__return_storage_ptr__->calls)._M_t,
              (_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
               *)&local_1a0);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::~_Rb_tree((_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
               *)&local_1a0);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=(&(__return_storage_ptr__->indirects)._M_t,&local_158.m_indirects._M_t);
  CFG::nodes_abi_cxx11_((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&local_1a0,cfg);
  if ((_List_node_base *)local_1a0._M_impl._0_8_ != (_List_node_base *)&local_1a0) {
    p_Var5 = (_List_node_base *)local_1a0._M_impl._0_8_;
    do {
      if (*(int *)(*(long *)(p_Var5 + 1) + 8) == 1) {
        lVar4 = *(long *)(*(long *)(p_Var5 + 1) + 0x10);
        plVar6 = *(long **)(lVar4 + 0x18);
        lVar4 = lVar4 + 0x18;
        if (plVar6 != (long *)lVar4) {
          lVar3 = 0;
          do {
            lVar2 = plVar6[2];
            if (lVar3 != 0) {
              local_170.from = *(Addr *)(lVar3 + 8);
              local_170.to = *(Addr *)(lVar2 + 8);
              local_170._vptr_Edge = (_func_int **)&PTR__Edge_00117b28;
              std::
              _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
              ::_M_insert_unique<CfgData::Edge>
                        ((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                          *)&__return_storage_ptr__->edges,&local_170);
            }
            plVar6 = (long *)*plVar6;
            lVar3 = lVar2;
          } while (plVar6 != (long *)lVar4);
        }
      }
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)&local_1a0);
  }
  while ((_List_node_base *)local_1a0._M_impl._0_8_ != (_List_node_base *)&local_1a0) {
    p_Var5 = (((_List_base<CfgNode_*,_std::allocator<CfgNode_*>_> *)
              &((_List_node_base *)local_1a0._M_impl._0_8_)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete((void *)local_1a0._M_impl._0_8_);
    local_1a0._M_impl._0_8_ = p_Var5;
  }
  CfgData::~CfgData(&local_158);
  return __return_storage_ptr__;
}

Assistant:

SpecificStrategy::Info SpecificStrategy::extractInfo(CFG* cfg) {
	SpecificStrategy::Info info;

	CfgData data(cfg);
	info.instrs = data.instrs();
	info.blocks.perfect = data.blocks();
	info.phantoms = data.phantoms();
	info.edges.external.perfect = data.edges();
	info.calls = data.calls();
	info.indirects = data.indirects();

	for (CfgNode* node : cfg->nodes()) {
		if (node->type() != CfgNode::CFG_BLOCK)
			continue;

		CfgNode::BlockData* block = static_cast<CfgNode::BlockData*>(node->data());
		Instruction* previous = 0;
		for (Instruction* instr : block->instructions()) {
			if (previous != 0)
				info.edges.internal.perfect.insert(CfgData::Edge(previous->addr(), instr->addr()));

			previous = instr;
		}
	}

	return info;
}